

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

jx9_vm_func * VmOverload(jx9_vm *pVm,jx9_vm_func *pList,jx9_value *aArg,int nArg)

{
  int iVar1;
  int local_d4;
  undefined1 local_d0 [4];
  int c;
  SyBlob sSig;
  SyString sArgSig;
  jx9_vm_func *pLink;
  jx9_vm_func *apSet [10];
  int local_40;
  int iMax;
  int iCur;
  int j;
  int i;
  int iTarget;
  int nArg_local;
  jx9_value *aArg_local;
  jx9_vm_func *pList_local;
  jx9_vm *pVm_local;
  
  iCur = 0;
  for (sArgSig._8_8_ = pList; (iCur < 10 && (sArgSig._8_8_ != 0));
      sArgSig._8_8_ = *(undefined8 *)(sArgSig._8_8_ + 0xa8)) {
    if (*(int *)(sArgSig._8_8_ + 0x10) == nArg) {
      apSet[(long)iCur + -1] = (jx9_vm_func *)sArgSig._8_8_;
      iCur = iCur + 1;
    }
  }
  pVm_local = (jx9_vm *)pList;
  if (0 < iCur) {
    if ((nArg < 1) || (iCur < 2)) {
      pVm_local = (jx9_vm *)pLink;
    }
    else {
      SyBlobInit((SyBlob *)local_d0,&pVm->sAllocator);
      for (iMax = 0; iMax < nArg; iMax = iMax + 1) {
        local_d4 = 0x6e;
        if ((aArg[iMax].iFlags & 0x40U) == 0) {
          if ((aArg[iMax].iFlags & 8U) == 0) {
            if ((aArg[iMax].iFlags & 2U) == 0) {
              if ((aArg[iMax].iFlags & 1U) == 0) {
                if ((aArg[iMax].iFlags & 4U) != 0) {
                  local_d4 = 0x66;
                }
              }
              else {
                local_d4 = 0x73;
              }
            }
            else {
              local_d4 = 0x69;
            }
          }
          else {
            local_d4 = 0x62;
          }
        }
        else {
          local_d4 = 0x68;
        }
        if (local_d4 != 0) {
          SyBlobAppend((SyBlob *)local_d0,&local_d4,1);
        }
      }
      sSig._24_8_ = sSig.pAllocator;
      j = 0;
      local_40 = -1;
      for (iMax = 0; iMax < iCur; iMax = iMax + 1) {
        iVar1 = VmOverloadCompare((SyString *)&sSig.nFlags,&apSet[(long)iMax + -1]->sSignature);
        if (local_40 < iVar1) {
          j = iMax;
          local_40 = iVar1;
        }
      }
      SyBlobRelease((SyBlob *)local_d0);
      pVm_local = (jx9_vm *)apSet[(long)j + -1];
    }
  }
  return (jx9_vm_func *)pVm_local;
}

Assistant:

static jx9_vm_func * VmOverload(
	jx9_vm *pVm,         /* Target VM */
	jx9_vm_func *pList,  /* Linked list of candidates for overloading */
	jx9_value *aArg,     /* Array of passed arguments */
	int nArg             /* Total number of passed arguments  */
	)
{
	int iTarget, i, j, iCur, iMax;
	jx9_vm_func *apSet[10];   /* Maximum number of candidates */
	jx9_vm_func *pLink;
	SyString sArgSig;
	SyBlob sSig;

	pLink = pList;
	i = 0;
	/* Put functions expecting the same number of passed arguments */
	while( i < (int)SX_ARRAYSIZE(apSet) ){
		if( pLink == 0 ){
			break;
		}
		if( (int)SySetUsed(&pLink->aArgs) == nArg ){
			/* Candidate for overloading */
			apSet[i++] = pLink;
		}
		/* Point to the next entry */
		pLink = pLink->pNextName;
	}
	if( i < 1 ){
		/* No candidates, return the head of the list */
		return pList;
	}
	if( nArg < 1 || i < 2 ){
		/* Return the only candidate */
		return apSet[0];
	}
	/* Calculate function signature */
	SyBlobInit(&sSig, &pVm->sAllocator);
	for( j = 0 ; j < nArg ; j++ ){
		int c = 'n'; /* null */
		if( aArg[j].iFlags & MEMOBJ_HASHMAP ){
			/* Hashmap */
			c = 'h';
		}else if( aArg[j].iFlags & MEMOBJ_BOOL ){
			/* bool */
			c = 'b';
		}else if( aArg[j].iFlags & MEMOBJ_INT ){
			/* int */
			c = 'i';
		}else if( aArg[j].iFlags & MEMOBJ_STRING ){
			/* String */
			c = 's';
		}else if( aArg[j].iFlags & MEMOBJ_REAL ){
			/* Float */
			c = 'f';
		}
		if( c > 0 ){
			SyBlobAppend(&sSig, (const void *)&c, sizeof(char));
		}
	}
	SyStringInitFromBuf(&sArgSig, SyBlobData(&sSig), SyBlobLength(&sSig));
	iTarget = 0;
	iMax = -1;
	/* Select the appropriate function */
	for( j = 0 ; j < i ; j++ ){
		/* Compare the two signatures */
		iCur = VmOverloadCompare(&sArgSig, &apSet[j]->sSignature);
		if( iCur > iMax ){
			iMax = iCur;
			iTarget = j;
		}
	}
	SyBlobRelease(&sSig);
	/* Appropriate function for the current call context */
	return apSet[iTarget];
}